

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O0

HPDF_UINT32 HPDF_GetStreamSize(HPDF_Doc pdf)

{
  HPDF_BOOL HVar1;
  HPDF_STATUS HVar2;
  HPDF_Doc pdf_local;
  
  HVar1 = HPDF_HasDoc(pdf);
  if (HVar1 == 0) {
    pdf_local._4_4_ = 0x1025;
  }
  else {
    HVar2 = HPDF_Stream_Validate(pdf->stream);
    if (HVar2 == 0) {
      pdf_local._4_4_ = 0;
    }
    else {
      pdf_local._4_4_ = HPDF_Stream_Size(pdf->stream);
    }
  }
  return pdf_local._4_4_;
}

Assistant:

HPDF_EXPORT(HPDF_UINT32)
HPDF_GetStreamSize  (HPDF_Doc   pdf)
{
    HPDF_PTRACE ((" HPDF_GetStreamSize\n"));

    if (!HPDF_HasDoc (pdf))
        return HPDF_INVALID_DOCUMENT;

    if (!HPDF_Stream_Validate (pdf->stream))
        return 0;

    return HPDF_Stream_Size(pdf->stream);
}